

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.cpp
# Opt level: O0

void __thiscall
license::CryptoHelper::loadPrivateKey_file(CryptoHelper *this,string *privateKey_file_name)

{
  bool bVar1;
  logic_error *this_00;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_2d9;
  undefined1 local_2d8 [12];
  undefined1 local_2c8 [12];
  string local_2b8 [8];
  string pk_string;
  ifstream private_key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  path local_38;
  string *local_18;
  string *privateKey_file_name_local;
  CryptoHelper *this_local;
  
  local_18 = privateKey_file_name;
  privateKey_file_name_local = (string *)this;
  boost::filesystem::path::path(&local_38,privateKey_file_name);
  bVar1 = boost::filesystem::exists(&local_38);
  boost::filesystem::path::~path(&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::ifstream::ifstream((istream_type *)(pk_string.field_2._M_local_buf + 8),local_18,8);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_2c8,
               (istream_type *)(pk_string.field_2._M_local_buf + 8));
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_2d8);
    std::allocator<char>::allocator();
    __beg._12_4_ = 0;
    __beg._M_sbuf = (streambuf_type *)local_2c8._0_8_;
    __beg._M_c = local_2c8._8_4_;
    __end._12_4_ = 0;
    __end._M_sbuf = (streambuf_type *)local_2d8._0_8_;
    __end._M_c = local_2d8._8_4_;
    std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              (local_2b8,__beg,__end,&local_2d9);
    std::allocator<char>::~allocator(&local_2d9);
    (*this->_vptr_CryptoHelper[4])(this,local_2b8);
    std::__cxx11::string::~string(local_2b8);
    std::ifstream::~ifstream((void *)((long)&pk_string.field_2 + 8));
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_88,"Private key file [",local_18);
  std::operator+(&local_68,&local_88,"] does not exists");
  std::logic_error::logic_error(this_00,(string *)&local_68);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void CryptoHelper::loadPrivateKey_file(const std::string &privateKey_file_name) {
	if (!fs::exists(privateKey_file_name)) {
		throw logic_error("Private key file [" + privateKey_file_name + "] does not exists");
	}
	std::ifstream private_key(privateKey_file_name);
	std::string pk_string((std::istreambuf_iterator<char>(private_key)), std::istreambuf_iterator<char>());
	loadPrivateKey(pk_string);
}